

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

ON_Curve * __thiscall ON_BrepTrim::TrimCurveOf(ON_BrepTrim *this)

{
  int iVar1;
  int iVar2;
  ON_Curve **ppOVar3;
  ON_Curve *local_18;
  ON_Curve *c2;
  ON_BrepTrim *this_local;
  
  local_18 = ON_CurveProxy::ProxyCurve(&this->super_ON_CurveProxy);
  if ((((local_18 == (ON_Curve *)0x0) && (this->m_brep != (ON_Brep *)0x0)) && (-1 < this->m_c2i)) &&
     (iVar1 = this->m_c2i,
     iVar2 = ON_SimpleArray<ON_Curve_*>::Count
                       (&(this->m_brep->m_C2).super_ON_SimpleArray<ON_Curve_*>), iVar1 < iVar2)) {
    ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_brep->m_C2).super_ON_SimpleArray<ON_Curve_*>,this->m_c2i);
    local_18 = *ppOVar3;
    if (local_18 != (ON_Curve *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_brep.cpp"
                 ,0x32ca,"","ON_BrepTrim ProxyCurve() = nullptr but m_c2i is valid");
    }
  }
  return local_18;
}

Assistant:

const ON_Curve* ON_BrepTrim::TrimCurveOf() const
{
  const ON_Curve* c2 = ProxyCurve();
  if ( !c2 && m_brep && m_c2i >= 0 && m_c2i < m_brep->m_C2.Count() )
  {
    // fallback to get answer if developer forgot to
    // set proxy ptr.
    c2 = m_brep->m_C2[m_c2i];
    if ( c2 )
    {
      ON_ERROR("ON_BrepTrim ProxyCurve() = nullptr but m_c2i is valid");
    }
  }
  return c2;
}